

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluent_builder.cpp
# Opt level: O0

string * __thiscall
HtmlElement::str_abi_cxx11_(string *__return_storage_ptr__,HtmlElement *this,int indent_size)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  string local_238;
  reference local_218;
  HtmlElement *e;
  const_iterator __end1;
  const_iterator __begin1;
  vector<HtmlElement,_std::allocator<HtmlElement>_> *__range1;
  string local_1f0 [55];
  allocator<char> local_1b9;
  string local_1b8 [8];
  string indent_str;
  ostringstream out;
  int indent_size_local;
  HtmlElement *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(indent_str.field_2._M_local_buf + 8))
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,(long)indent_size,' ',&local_1b9);
  std::allocator<char>::~allocator(&local_1b9);
  poVar2 = std::operator<<((ostream *)(indent_str.field_2._M_local_buf + 8),local_1b8);
  poVar2 = std::operator<<(poVar2,"<");
  poVar2 = std::operator<<(poVar2,(string *)this);
  poVar2 = std::operator<<(poVar2,">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_1f0,(long)indent_size * 2,' ',(allocator<char> *)((long)&__range1 + 7));
    poVar2 = std::operator<<((ostream *)(indent_str.field_2._M_local_buf + 8),local_1f0);
    poVar2 = std::operator<<(poVar2,(string *)&this->contents);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  }
  __end1 = std::vector<HtmlElement,_std::allocator<HtmlElement>_>::begin(&this->children);
  e = (HtmlElement *)std::vector<HtmlElement,_std::allocator<HtmlElement>_>::end(&this->children);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_HtmlElement_*,_std::vector<HtmlElement,_std::allocator<HtmlElement>_>_>
                                *)&e);
    if (!bVar1) break;
    local_218 = __gnu_cxx::
                __normal_iterator<const_HtmlElement_*,_std::vector<HtmlElement,_std::allocator<HtmlElement>_>_>
                ::operator*(&__end1);
    str_abi_cxx11_(&local_238,local_218,2);
    std::operator<<((ostream *)(indent_str.field_2._M_local_buf + 8),(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    __gnu_cxx::
    __normal_iterator<const_HtmlElement_*,_std::vector<HtmlElement,_std::allocator<HtmlElement>_>_>
    ::operator++(&__end1);
  }
  poVar2 = std::operator<<((ostream *)(indent_str.field_2._M_local_buf + 8),local_1b8);
  poVar2 = std::operator<<(poVar2,"</");
  poVar2 = std::operator<<(poVar2,(string *)this);
  poVar2 = std::operator<<(poVar2,">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(indent_str.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string str(int indent_size = 0) const
	{
		std::ostringstream out;
		std::string indent_str(indent_size * base_indent, ' ');
		out << indent_str << "<" << tag_name << ">" << std::endl;;

		if(!contents.empty())
		{
			out << std::string(indent_size * (base_indent + 1), ' ') << contents << std::endl;;
		}

		for(const auto& e : children)
		{
			out << e.str(base_indent + 1);
		}

		out << indent_str << "</" << tag_name << ">" << std::endl;;
		return out.str();
	}